

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerman_tests.cpp
# Opt level: O0

void peerman_tests::mineBlock(NodeContext *node,seconds block_time)

{
  long lVar1;
  uint256 hash;
  bool bVar2;
  Params *val;
  pointer __args;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1L>_> curr_time;
  Options options;
  CBlock block;
  ChainstateManager *in_stack_fffffffffffffd98;
  CBlock *in_stack_fffffffffffffda0;
  ChainstateManager *in_stack_fffffffffffffda8;
  seconds in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  undefined8 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 uVar3;
  undefined8 in_stack_fffffffffffffe00;
  Options *in_stack_fffffffffffffe10;
  CTxMemPool *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  BlockAssembler *in_stack_fffffffffffffe28;
  bool *in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  shared_ptr<const_CBlock> *in_stack_fffffffffffffe80;
  ChainstateManager *in_stack_fffffffffffffe88;
  ChainstateManager *local_b8;
  CScript *in_stack_ffffffffffffffa8;
  BlockAssembler *in_stack_ffffffffffffffb0;
  undefined4 local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  SetMockTime(in_stack_fffffffffffffdb8);
  ::node::BlockAssembler::Options::Options((Options *)in_stack_fffffffffffffd98);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffd98);
  ChainstateManager::ActiveChainstate(in_stack_fffffffffffffda8);
  ::node::BlockAssembler::BlockAssembler
            (in_stack_fffffffffffffe28,
             (Chainstate *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  CScript::CScript((CScript *)in_stack_fffffffffffffd98);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                      (opcodetype)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  ::node::BlockAssembler::CreateNewBlock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator->
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_fffffffffffffd98);
  CBlock::CBlock((CBlock *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             in_stack_fffffffffffffda8);
  CScript::~CScript((CScript *)in_stack_fffffffffffffd98);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)in_stack_fffffffffffffd98);
  do {
    CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffffdb8.__r);
    uVar3 = local_30;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffffd98);
    val = ChainstateManager::GetConsensus(in_stack_fffffffffffffd98);
    hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_RDI;
    hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((ulong)in_RDI >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[10] = (char)((ulong)in_RDI >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((ulong)in_RDI >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)((ulong)in_RDI >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((ulong)in_RDI >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((ulong)in_RDI >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((ulong)in_RDI >> 0x38);
    hash.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffffe00;
    hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)in_stack_fffffffffffffe00 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)in_stack_fffffffffffffe00 >> 0x10)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)in_stack_fffffffffffffe00 >> 0x18)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)in_stack_fffffffffffffe00 >> 0x20)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)in_stack_fffffffffffffe00 >> 0x28)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)in_stack_fffffffffffffe00 >> 0x30)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)in_stack_fffffffffffffe00 >> 0x38)
    ;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_fffffffffffffe10;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffffe18;
    in_stack_fffffffffffffd98 = local_b8;
    bVar2 = CheckProofOfWork(hash,(uint)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                             (Params *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                            );
    in_stack_fffffffffffffdd0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffdd0);
  } while (((bVar2 ^ 0xffU) & 1) != 0);
  SetMockTime(in_stack_fffffffffffffdb8);
  __args = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffffd98);
  std::make_shared<CBlock_const,CBlock&>((CBlock *)__args);
  bVar2 = ChainstateManager::ProcessNewBlock
                    (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                     (bool)in_stack_fffffffffffffe7f,(bool)in_stack_fffffffffffffe7e,
                     in_stack_fffffffffffffe70);
  inline_assertion_check<true,bool>
            ((bool *)val,(char *)CONCAT44(uVar3,in_stack_fffffffffffffdd0),
             (int)((ulong)__args >> 0x20),(char *)CONCAT17(bVar2,in_stack_fffffffffffffdc0),
             (char *)in_stack_fffffffffffffdb8.__r);
  std::shared_ptr<const_CBlock>::~shared_ptr((shared_ptr<const_CBlock> *)in_stack_fffffffffffffd98);
  std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
             in_stack_fffffffffffffd98);
  ValidationSignals::SyncWithValidationInterfaceQueue((ValidationSignals *)__args);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffffd98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void mineBlock(const node::NodeContext& node, std::chrono::seconds block_time)
{
    auto curr_time = GetTime<std::chrono::seconds>();
    SetMockTime(block_time); // update time so the block is created with it
    node::BlockAssembler::Options options;
    CBlock block = node::BlockAssembler{node.chainman->ActiveChainstate(), nullptr, options}.CreateNewBlock(CScript() << OP_TRUE)->block;
    while (!CheckProofOfWork(block.GetHash(), block.nBits, node.chainman->GetConsensus())) ++block.nNonce;
    block.fChecked = true; // little speedup
    SetMockTime(curr_time); // process block at current time
    Assert(node.chainman->ProcessNewBlock(std::make_shared<const CBlock>(block), /*force_processing=*/true, /*min_pow_checked=*/true, nullptr));
    node.validation_signals->SyncWithValidationInterfaceQueue(); // drain events queue
}